

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

RunElement __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::ReplayGames
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          Games *losers,idx_t slot_idx,RunElement *insert_val)

{
  pair<unsigned_int,_unsigned_long> *ppVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  RunElement RVar9;
  
  uVar4 = (ulong)insert_val->first;
  uVar6 = insert_val->second;
  uVar7 = slot_idx + 0x1f;
  do {
    uVar5 = uVar7 - 1;
    uVar7 = uVar5 >> 1;
    ppVar1 = losers->_M_elems + uVar7;
    uVar2 = losers->_M_elems[uVar7].first;
    uVar3 = (uint)uVar4;
    if (uVar2 < uVar3) {
      uVar8 = ppVar1->second;
LAB_00a9cc81:
      ppVar1->first = uVar3;
      ppVar1->second = uVar6;
      uVar4 = (ulong)uVar2;
      uVar6 = uVar8;
    }
    else if ((uVar2 <= uVar3) && (uVar8 = ppVar1->second, uVar8 < uVar6)) goto LAB_00a9cc81;
    if (uVar5 < 2) {
      RVar9.second = uVar6;
      RVar9._0_8_ = uVar4;
      return RVar9;
    }
  } while( true );
}

Assistant:

RunElement ReplayGames(Games &losers, idx_t slot_idx, const RunElement &insert_val) {
		RunElement smallest = insert_val;
		//	Start at a fake level below
		auto idx = slot_idx + losers.size();
		do {
			// Parent index
			idx = (idx - 1) / 2;
			// swap if out of order
			if (cmp(losers[idx], smallest)) {
				std::swap(losers[idx], smallest);
			}
		} while (idx);

		return smallest;
	}